

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O0

void __thiscall
glcts::MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest::
deinitInternalIteration
          (MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  if (this->to_id != 0) {
    (**(code **)(lVar4 + 0x480))(1,&this->to_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Failed to delete texture object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                    ,0x37b);
    this->to_id = 0;
  }
  (**(code **)(lVar4 + 0xb8))(0x9100,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,
                  "Failed to unbind a texture object from GL_TEXTURE_2D_MULTISAMPLE texture target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,900);
  return;
}

Assistant:

void MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest::deinitInternalIteration()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (to_id != 0)
	{
		/* Delete texture object */
		gl.deleteTextures(1, &to_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to delete texture object");

		to_id = 0;
	}

	/* Unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE texture target */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"Failed to unbind a texture object from GL_TEXTURE_2D_MULTISAMPLE texture target");
}